

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_Vk.cpp
# Opt level: O3

void __thiscall
Diligent::SerializedPipelineStateImpl::PatchShadersVk<Diligent::TilePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,TilePipelineStateCreateInfo *CreateInfo)

{
  size_type *psVar1;
  pointer pvVar2;
  Uint32 SignatureCount;
  TilePipelineStateCreateInfo *pTVar3;
  pointer pSVar4;
  pointer pSVar5;
  int iVar6;
  undefined4 extraout_var;
  size_t sVar7;
  char (*in_RCX) [57];
  char *Args_1;
  TBindIndexToDescSetIndex *BindIndexToDescSetIndex;
  long lVar8;
  char *pcVar9;
  IShader *pIVar10;
  SerializedResourceSignatureImpl **ppSrcSignatures;
  pointer *ppvVar11;
  size_t i;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  char *pcVar15;
  ShaderStageInfo *this_00;
  Uint32 SignaturesCount;
  string msg_5;
  TShaderStages ShaderStagesVk;
  string msg;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ShaderStages;
  RefCntAutoPtr<Diligent::SerializedShaderImpl> pShaderImpl;
  IPipelineResourceSignature *DefaultSignatures [1];
  Uint32 local_17c;
  string local_178;
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  local_158;
  TilePipelineStateCreateInfo *local_140;
  undefined1 local_138 [32];
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 local_118;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> RStack_110;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> local_108;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> RStack_100;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  local_98;
  TBindIndexToDescSetIndex local_78;
  pointer local_50;
  ulong local_48;
  SerializedPipelineStateImpl *local_40;
  SerializedResourceSignatureImpl *local_38;
  
  local_98.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_LAST) {
    FormatString<char[26],char[36]>
              ((string *)local_138,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsTilePipeline()",(char (*) [36])in_RCX);
    in_RCX = (char (*) [57])0x15a;
    DebugAssertionFailed
              ((Char *)local_138._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x15a);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ::_M_erase_at_end(&local_98,(pointer)0x0);
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_LAST) {
    FormatString<char[26],char[54]>
              ((string *)local_138,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.PipelineType == PIPELINE_TYPE_TILE",
               (char (*) [54])in_RCX);
    in_RCX = (char (*) [57])0x15e;
    DebugAssertionFailed
              ((Char *)local_138._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x15e);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  pIVar10 = CreateInfo->pTS;
  if (pIVar10 == (IShader *)0x0) {
    FormatString<char[26],char[26]>
              ((string *)local_138,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pTS != nullptr",(char (*) [26])in_RCX);
    in_RCX = (char (*) [57])0x15f;
    DebugAssertionFailed
              ((Char *)local_138._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x15f);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    pIVar10 = CreateInfo->pTS;
  }
  iVar6 = (*(pIVar10->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar6) + 8) != 0x4000) {
    FormatString<char[26],char[57]>
              ((string *)local_138,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pTS->GetDesc().ShaderType == SHADER_TYPE_TILE",in_RCX);
    in_RCX = (char (*) [57])0x160;
    DebugAssertionFailed
              ((Char *)local_138._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x160);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  pIVar10 = CreateInfo->pTS;
  local_78._M_elems[0] = 0;
  local_78._M_elems[1] = 0;
  if (pIVar10 != (IShader *)0x0) {
    (**(pIVar10->super_IDeviceObject).super_IObject._vptr_IObject)
              (pIVar10,SerializedShaderImpl::IID_InternalImpl,&local_78);
    if (local_78._M_elems._0_8_ != 0) goto LAB_001de88c;
  }
  FormatString<char[40]>
            ((string *)local_138,(char (*) [40])"Unexpected shader object implementation");
  in_RCX = (char (*) [57])0x163;
  DebugAssertionFailed
            ((Char *)local_138._0_8_,"ExtractShaders",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
             ,0x163);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
LAB_001de88c:
  PipelineStateUtils::WaitUntilShaderReadyIfRequested<Diligent::SerializedShaderImpl>
            ((RefCntAutoPtr<Diligent::SerializedShaderImpl> *)&local_78,true);
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>>
  ::emplace_back<Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>&>
            ((vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>>
              *)&local_98,(RefCntAutoPtr<Diligent::SerializedShaderImpl> *)&local_78);
  pSVar5 = local_98.
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = local_98.
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_140 = CreateInfo;
  if (local_98.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_98.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[22]>
              ((string *)local_138,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])in_RCX);
    DebugAssertionFailed
              ((Char *)local_138._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x168);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  RefCntAutoPtr<Diligent::SerializedShaderImpl>::Release
            ((RefCntAutoPtr<Diligent::SerializedShaderImpl> *)&local_78);
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::vector(&local_158,((long)pSVar5 - (long)pSVar4 >> 4) * -0x3333333333333333,
           (allocator_type *)local_138);
  if (local_158.
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_158.
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppvVar11 = &(pSVar4->super_ShaderStageInfo).SPIRVs.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar8 = 0x30;
    uVar12 = 0;
    do {
      psVar1 = (size_type *)
               ((long)&(local_158.
                        super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start)->Type + lVar8);
      *(int *)(psVar1 + -6) = (int)ppvVar11[-6];
      std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
      _M_move_assign((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                      *)(psVar1 + -5),ppvVar11 + -5);
      local_138._16_8_ = *psVar1;
      pvVar2 = ppvVar11[-1];
      local_138._0_8_ = psVar1[-2];
      local_138._8_8_ = psVar1[-1];
      psVar1[-2] = (size_type)((_Vector_impl_data *)(ppvVar11 + -2))->_M_start;
      psVar1[-1] = (size_type)pvVar2;
      *psVar1 = (size_type)*ppvVar11;
      ((_Vector_impl_data *)(ppvVar11 + -2))->_M_start = (pointer)0x0;
      ppvVar11[-1] = (pointer)0x0;
      *ppvVar11 = (pointer)0x0;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_138);
      uVar12 = uVar12 + 1;
      ppvVar11 = ppvVar11 + 10;
      lVar8 = lVar8 + 0x38;
    } while (uVar12 < (ulong)(((long)local_158.
                                     super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_158.
                                     super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  pTVar3 = local_140;
  ppSrcSignatures =
       (SerializedResourceSignatureImpl **)
       (local_140->super_PipelineStateCreateInfo).ppResourceSignatures;
  local_17c = (local_140->super_PipelineStateCreateInfo).ResourceSignaturesCount;
  local_38 = (SerializedResourceSignatureImpl *)0x0;
  if (local_17c == 0) {
    CreateDefaultResourceSignature<Diligent::PipelineStateVkImpl,Diligent::PipelineResourceSignatureVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
              (this,Vulkan,(PipelineStateDesc *)local_140,SHADER_TYPE_LAST,&local_158);
    local_38 = (this->m_pDefaultSignature).m_pObject;
    ppSrcSignatures = &local_38;
    local_17c = 1;
  }
  local_108.m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  RStack_100.m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_118.SourceLength = 0;
  RStack_110.m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_138._16_8_ = 0;
  local_138._24_8_ = 0;
  local_138._0_8_ = (Char *)0x0;
  local_138._8_8_ = (PipelineResourceSignatureVkImpl *)0x0;
  Args_1 = (char *)&local_17c;
  anon_unknown_60::SortResourceSignatures<Diligent::PipelineResourceSignatureVkImpl>
            ((IPipelineResourceSignature **)ppSrcSignatures,local_17c,
             (SignatureArray<Diligent::PipelineResourceSignatureVkImpl> *)local_138,(Uint32 *)Args_1
            );
  SignatureCount = local_17c;
  local_78._M_elems[4] = 0;
  local_78._M_elems[5] = 0;
  local_78._M_elems[6] = 0;
  local_78._M_elems[7] = 0;
  local_78._M_elems[0] = 0;
  local_78._M_elems[1] = 0;
  local_78._M_elems[2] = 0;
  local_78._M_elems[3] = 0;
  pcVar15 = (char *)(ulong)local_17c;
  if (pcVar15 != (char *)0x0) {
    pcVar9 = (char *)0x0;
    uVar14 = 0;
    do {
      lVar8 = *(long *)(local_138 + (long)pcVar9 * 8);
      if (lVar8 != 0) {
        if (pcVar9 != (char *)(ulong)*(byte *)(lVar8 + 0x3c)) {
          FormatString<char[26],char[40]>
                    (&local_178,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"pSignature->GetDesc().BindingIndex == i",
                     (char (*) [40])(ulong)*(byte *)(lVar8 + 0x3c));
          DebugAssertionFailed
                    (local_178._M_dataplus._M_p,"PatchShadersVk",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
                     ,0xa4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          lVar8 = *(long *)(local_138 + (long)pcVar9 * 8);
        }
        local_78._M_elems[(long)pcVar9] = uVar14;
        local_178._M_dataplus._M_p = (Char *)0x0;
        local_178._M_string_length = 1;
        Args_1 = (char *)0x0;
        do {
          uVar14 = uVar14 + (*(int *)(lVar8 + 0x108 +
                                     *(long *)((long)&local_178._M_dataplus._M_p + (long)Args_1) * 4
                                     ) != -1);
          Args_1 = *(char (*) [50])Args_1 + 8;
        } while (Args_1 != (char *)0x10);
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 != pcVar15);
    if (0x10 < uVar14) {
      FormatString<char[26],char[50]>
                (&local_178,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2",
                 (char (*) [50])Args_1);
      DebugAssertionFailed
                (local_178._M_dataplus._M_p,"PatchShadersVk",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
                 ,0xad);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
  }
  BindIndexToDescSetIndex = &local_78;
  PipelineStateVkImpl::RemapOrVerifyShaderResources
            (&local_158,(RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)local_138,
             SignatureCount,BindIndexToDescSetIndex,false,(this->m_Data).Aux.NoShaderReflection,
             (pTVar3->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name,
             (TShaderResources *)0x0,(TResourceAttibutions *)0x0);
  lVar8 = 0x38;
  do {
    RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::Release
              ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)(local_138 + lVar8));
    lVar8 = lVar8 + -8;
  } while (lVar8 != -8);
  if ((this->m_Data).Shaders._M_elems[3].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_Data).Shaders._M_elems[3].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[64]>
              ((string *)local_138,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Data.Shaders[static_cast<size_t>(DeviceType::Vulkan)].empty()",
               (char (*) [64])BindIndexToDescSetIndex);
    DebugAssertionFailed
              ((Char *)local_138._0_8_,"PatchShadersVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
               ,0xb9);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  local_40 = this;
  if (local_158.
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_158.
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_50 = local_98.
               super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      this_00 = local_158.
                super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar12;
      local_140 = (TilePipelineStateCreateInfo *)&local_50[uVar12].Serialized;
      lVar8 = 1;
      uVar13 = 0;
      local_48 = uVar12;
      while( true ) {
        sVar7 = PipelineStateVkImpl::ShaderStageInfo::Count(this_00);
        if (sVar7 <= uVar13) break;
        pvVar2 = (this_00->SPIRVs).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        memcpy((ShaderCreateInfo *)local_138,
               (void *)(*(long *)((local_140->super_PipelineStateCreateInfo).PSODesc.
                                  super_DeviceObjectAttribs.Name + uVar13 * 8) + 0x18),0x98);
        local_138._16_8_ = 0;
        local_138._0_8_ = (Char *)0x0;
        local_108.m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
        RStack_100.m_pObject = RStack_100.m_pObject & 0xffffffff00000000;
        local_138._24_8_ = *(long *)((long)pvVar2 + lVar8 * 8 + -8);
        local_118.SourceLength =
             (long)(&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start)[lVar8] - local_138._24_8_;
        SerializeShaderCreateInfo(local_40,Vulkan,(ShaderCreateInfo *)local_138);
        uVar13 = uVar13 + 1;
        lVar8 = lVar8 + 3;
      }
      uVar12 = local_48 + 1;
    } while (uVar12 < (ulong)(((long)local_158.
                                     super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_158.
                                     super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::~vector(&local_158);
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void SerializedPipelineStateImpl::PatchShadersVk(const CreateInfoType& CreateInfo) noexcept(false)
{
    std::vector<ShaderStageInfoVk> ShaderStages;
    SHADER_TYPE                    ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
    constexpr bool                 WaitUntilShadersReady = true;
    PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

    PipelineStateVkImpl::TShaderStages ShaderStagesVk{ShaderStages.size()};
    for (size_t i = 0; i < ShaderStagesVk.size(); ++i)
    {
        auto& Src   = ShaderStages[i];
        auto& Dst   = ShaderStagesVk[i];
        Dst.Type    = Src.Type;
        Dst.Shaders = std::move(Src.Shaders);
        Dst.SPIRVs  = std::move(Src.SPIRVs);
    }

    auto** ppSignatures    = CreateInfo.ppResourceSignatures;
    auto   SignaturesCount = CreateInfo.ResourceSignaturesCount;

    IPipelineResourceSignature* DefaultSignatures[1] = {};
    if (CreateInfo.ResourceSignaturesCount == 0)
    {
        CreateDefaultResourceSignature<PipelineStateVkImpl, PipelineResourceSignatureVkImpl>(DeviceType::Vulkan, CreateInfo.PSODesc, ActiveShaderStages, ShaderStagesVk);

        DefaultSignatures[0] = m_pDefaultSignature;
        SignaturesCount      = 1;
        ppSignatures         = DefaultSignatures;
    }

    {
        // Sort signatures by binding index.
        // Note that SignaturesCount will be overwritten with the maximum binding index.
        SignatureArray<PipelineResourceSignatureVkImpl> Signatures = {};
        SortResourceSignatures(ppSignatures, SignaturesCount, Signatures, SignaturesCount);

        // Same as PipelineLayoutVk::Create()
        PipelineStateVkImpl::TBindIndexToDescSetIndex BindIndexToDescSetIndex = {};
        Uint32                                        DescSetLayoutCount      = 0;
        for (Uint32 i = 0; i < SignaturesCount; ++i)
        {
            const auto& pSignature = Signatures[i];
            if (pSignature == nullptr)
                continue;

            VERIFY_EXPR(pSignature->GetDesc().BindingIndex == i);
            BindIndexToDescSetIndex[i] = StaticCast<PipelineStateVkImpl::TBindIndexToDescSetIndex::value_type>(DescSetLayoutCount);

            for (auto SetId : {PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE, PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC})
            {
                if (pSignature->GetDescriptorSetSize(SetId) != ~0u)
                    ++DescSetLayoutCount;
            }
        }
        VERIFY_EXPR(DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2);

        const auto bStripReflection = m_Data.Aux.NoShaderReflection;
        PipelineStateVkImpl::RemapOrVerifyShaderResources(ShaderStagesVk,
                                                          Signatures.data(),
                                                          SignaturesCount,
                                                          BindIndexToDescSetIndex,
                                                          false, // bVerifyOnly
                                                          bStripReflection,
                                                          CreateInfo.PSODesc.Name);
    }

    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::Vulkan)].empty());
    for (size_t j = 0; j < ShaderStagesVk.size(); ++j)
    {
        const auto& Stage = ShaderStagesVk[j];
        for (size_t i = 0; i < Stage.Count(); ++i)
        {
            const auto& SPIRV     = Stage.SPIRVs[i];
            auto        ShaderCI  = ShaderStages[j].Serialized[i]->GetCreateInfo();
            ShaderCI.Source       = nullptr;
            ShaderCI.FilePath     = nullptr;
            ShaderCI.Macros       = {};
            ShaderCI.ByteCode     = SPIRV.data();
            ShaderCI.ByteCodeSize = SPIRV.size() * sizeof(SPIRV[0]);
            SerializeShaderCreateInfo(DeviceType::Vulkan, ShaderCI);
        }
    }
}